

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O3

vx_aabb_t * vx__aabb_merge(vx_aabb_t *__return_storage_ptr__,vx_aabb_t *a,vx_aabb_t *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  fVar1 = (a->min).field_0.v[0];
  fVar2 = (a->min).field_0.v[1];
  fVar3 = (a->min).field_0.v[2];
  fVar4 = (a->max).field_0.v[0];
  fVar5 = (b->min).field_0.v[0];
  fVar6 = (b->min).field_0.v[1];
  fVar7 = (b->min).field_0.v[2];
  fVar8 = (b->max).field_0.v[0];
  uVar9 = -(uint)(fVar5 < fVar1);
  uVar10 = -(uint)(fVar6 < fVar2);
  uVar11 = -(uint)(fVar7 < fVar3);
  uVar12 = -(uint)(fVar8 < fVar4);
  (__return_storage_ptr__->min).field_0.v[0] = (float)(~uVar9 & (uint)fVar1 | (uint)fVar5 & uVar9);
  (__return_storage_ptr__->min).field_0.v[1] = (float)(~uVar10 & (uint)fVar2 | (uint)fVar6 & uVar10)
  ;
  (__return_storage_ptr__->min).field_0.v[2] = (float)(~uVar11 & (uint)fVar3 | (uint)fVar7 & uVar11)
  ;
  (__return_storage_ptr__->max).field_0.v[0] = (float)(~uVar12 & (uint)fVar8 | (uint)fVar4 & uVar12)
  ;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)((long)&(a->max).field_0 + 4);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)((long)&(b->max).field_0 + 4);
  auVar14 = maxps(auVar13,auVar14);
  *(long *)((long)&(__return_storage_ptr__->max).field_0 + 4) = auVar14._0_8_;
  return __return_storage_ptr__;
}

Assistant:

vx_aabb_t vx__aabb_merge(vx_aabb_t* a, vx_aabb_t* b)
{
    vx_aabb_t merge;

    merge.min.x = VX_MIN(a->min.x, b->min.x);
    merge.min.y = VX_MIN(a->min.y, b->min.y);
    merge.min.z = VX_MIN(a->min.z, b->min.z);

    merge.max.x = VX_MAX(a->max.x, b->max.x);
    merge.max.y = VX_MAX(a->max.y, b->max.y);
    merge.max.z = VX_MAX(a->max.z, b->max.z);

    return merge;
}